

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O1

void yin_print_extcomplex_bool
               (lyout *out,int level,lys_module *module,lys_ext_instance_complex *ext,LY_STMT stmt,
               char *true_val,char *false_val,int *content)

{
  byte bVar1;
  char *pcVar2;
  LY_ERR *pLVar3;
  lyext_substmt *local_48;
  lyext_substmt *info;
  lys_module *local_38;
  
  info = (lyext_substmt *)true_val;
  local_38 = module;
  pcVar2 = (char *)lys_ext_complex_get_substmt(stmt,ext,&local_48);
  if ((pcVar2 != (char *)0x0) && (*pcVar2 != '\0')) {
    if ((content != (int *)0x0) && (*content == 0)) {
      *content = 1;
      ly_print(out,">\n");
    }
    if (*pcVar2 == '\x02') {
      bVar1 = ext->ext_size;
    }
    else {
      if (*pcVar2 != '\x01') {
        pLVar3 = ly_errno_location();
        *pLVar3 = LY_EINT;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_yin.c"
               ,0x719);
        return;
      }
      bVar1 = ext->ext_size;
      false_val = (char *)info;
    }
    yin_print_substmt(out,level,stmt,'\0',false_val,local_38,ext->ext,(uint)bVar1);
  }
  return;
}

Assistant:

static void
yin_print_extcomplex_bool(struct lyout *out, int level, const struct lys_module *module,
                          struct lys_ext_instance_complex *ext, LY_STMT stmt,
                          const char *true_val, const char *false_val, int *content)
{
    struct lyext_substmt *info;
    uint8_t *val;

    val = lys_ext_complex_get_substmt(stmt, ext, &info);
    if (!val || !(*val)) {
        return;
    }

    yin_print_close_parent(out, content);
    if (*val == 1) {
        yin_print_substmt(out, level, (LYEXT_SUBSTMT)stmt, 0, true_val, module, ext->ext, ext->ext_size);
    } else if (*val == 2) {
        yin_print_substmt(out, level, (LYEXT_SUBSTMT)stmt, 0, false_val, module, ext->ext, ext->ext_size);
    } else {
        LOGINT;
    }
}